

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGraphVizWriter.cxx
# Opt level: O0

void __thiscall cmGraphVizWriter::WriteHeader(cmGraphVizWriter *this,cmGeneratedFileStream *str)

{
  ostream *poVar1;
  cmGeneratedFileStream *str_local;
  cmGraphVizWriter *this_local;
  
  poVar1 = std::operator<<((ostream *)str,(string *)this);
  poVar1 = std::operator<<(poVar1," \"");
  poVar1 = std::operator<<(poVar1,(string *)&this->GraphName);
  poVar1 = std::operator<<(poVar1,"\" {");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)str,(string *)&this->GraphHeader);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void cmGraphVizWriter::WriteHeader(cmGeneratedFileStream& str) const
{
  str << this->GraphType << " \"" << this->GraphName << "\" {" << std::endl;
  str << this->GraphHeader << std::endl;
}